

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::showHeader(QFileDialogPrivate *this,QAction *action)

{
  QHeaderView *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QActionGroup *actionGroup;
  QFileDialog *q;
  QAction **in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffef;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QObject::sender();
  qobject_cast<QActionGroup*>((QObject *)0x75f496);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QTreeView::header((QTreeView *)in_RDI);
  QActionGroup::actions();
  QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
            ((QListSpecialMethodsBase<QAction_*> *)in_RDI,in_stack_ffffffffffffff98,0x75f4e4);
  QAction::isChecked();
  QHeaderView::setSectionHidden(in_RSI,(int)((ulong)lVar1 >> 0x20),(bool)in_stack_ffffffffffffffef);
  QList<QAction_*>::~QList((QList<QAction_*> *)0x75f511);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::showHeader(QAction *action)
{
    Q_Q(QFileDialog);
    QActionGroup *actionGroup = qobject_cast<QActionGroup*>(q->sender());
    qFileDialogUi->treeView->header()->setSectionHidden(int(actionGroup->actions().indexOf(action) + 1),
                                                        !action->isChecked());
}